

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.h
# Opt level: O0

void __thiscall cfd::core::Pubkey::Pubkey(Pubkey *this,Pubkey *param_1)

{
  Pubkey *param_1_local;
  Pubkey *this_local;
  
  ByteData::ByteData(&this->data_,&param_1->data_);
  return;
}

Assistant:

class CFD_CORE_EXPORT Pubkey {
 public:
  /**
   * @brief Uncompress Pubkey byte size
   */
  static constexpr uint32_t kPubkeySize = 65;
  /**
   * @brief Compress Pubkey byte size
   */
  static constexpr uint32_t kCompressedPubkeySize = 33;

  /**
   * @brief constructor
   */
  Pubkey();

  /**
   * @brief constructor
   * @param[in] byte_data   Public key ByteData instance
   */
  explicit Pubkey(ByteData byte_data);

  /**
   * @brief constructor
   * @param[in] hex_string Public Key HEX string
   */
  explicit Pubkey(const std::string &hex_string);

  /**
   * @brief Get HEX string.
   * @return HEX string.
   */
  std::string GetHex() const;

  /**
   * @brief Get ByteData instance.
   * @return ByteData
   */
  ByteData GetData() const;

  /**
   * @brief Returns whether the public key is in Compress format.
   * @retval true  compressed key.
   * @retval false uncompressed key.
   */
  bool IsCompress() const;

  /**
   * @brief Get y-parity flag.
   * @details This function is enable on compressed pubkey only.
   * @return parity bit
   */
  bool IsParity() const;

  /**
   * @brief Verify that the public key is in the correct format.
   * @retval true   valid format
   * @retval false  invalid format
   */
  bool IsValid() const;

  /**
   * @brief Check if the public keys match.
   * @param[in] pubkey check target Pubkey
   * @retval true   equal
   * @retval false  not equal
   */
  bool Equals(const Pubkey &pubkey) const;

  /**
   * @brief Get fingerprint.
   * @param[in] get_size    get fingerprint size.
   * @return fingerprint
   */
  ByteData GetFingerprint(uint32_t get_size = 4) const;

  /**
   * @brief Combine pubkeys.
   * @param[in] pubkeys Pubkey list
   * @return Combined pubkey
   */
  static Pubkey CombinePubkey(const std::vector<Pubkey> &pubkeys);

  /**
   * @brief Combine pubkey.
   * @param[in] pubkey base pubkey
   * @param[in] message_key combine pubkey
   * @return Combined pubkey
   */
  static Pubkey CombinePubkey(const Pubkey &pubkey, const Pubkey &message_key);

  /**
   * @brief Create new public key with tweak added.
   * @details This function doesn't have no side-effect.
   *     It always returns new instance of pubkey.
   * @param[in] tweak     tweak to be added
   * @return new instance of pubkey key with tweak added.
   */
  Pubkey CreateTweakAdd(const ByteData256 &tweak) const;

  /**
   * @brief Create new negated public key with tweak multiplied.
   * @details This function doesn't have no side-effect.
   *     It always returns new instance of pubkey.
   * @param[in] tweak     tweak to be added
   * @return new instance of pubkey key with tweak added.
   */
  Pubkey CreateTweakMul(const ByteData256 &tweak) const;

  /**
   * @brief Create new negated public key.
   * @details This function doesn't have no side-effect.
   *     It always returns new instance of pubkey.
   * @return new instance of pubkey key with tweak added.
   */
  Pubkey CreateNegate() const;

  /**
   * @brief Create new uncompressed public key.
   * @return new instance of pubkey key with uncompressed.
   */
  Pubkey Compress() const;

  /**
   * @brief Create new uncompressed public key.
   * @return new instance of pubkey key with uncompressed.
   */
  Pubkey Uncompress() const;

  /**
   * @brief Verify if a signature with respect to a public key and a message.
   * @param[in] signature_hash  the message to verify the signature against.
   * @param[in] signature       the signature to verify.
   * @return true if the signature is valid, false if not.
   */
  bool VerifyEcSignature(
      const ByteData256 &signature_hash, const ByteData &signature) const;

  /**
   * @brief Verify bitcoin message's signature.
   * @param[in] signature   message signature
   * @param[in] message     message
   * @param[out] pubkey     recovery pubkey
   * @return true if the signature is valid, false if not.
   */
  bool VerifyBitcoinMessage(
      const ByteData &signature, const std::string &message,
      Pubkey *pubkey = nullptr) const;
  /**
   * @brief Verify bitcoin message's signature.
   * @param[in] base64_signature  message signature with base64.
   * @param[in] message           message
   * @param[out] pubkey           recovery pubkey
   * @return true if the signature is valid, false if not.
   */
  bool VerifyBitcoinMessageWithBase64(
      const std::string &base64_signature, const std::string &message,
      Pubkey *pubkey = nullptr) const;
  /**
   * @brief Verify message's signature.
   * @param[in] signature       message signature
   * @param[in] message         message
   * @param[in] message_magic   magic string
   * @param[out] pubkey         recovery pubkey
   * @return true if the signature is valid, false if not.
   */
  bool VerifyMessage(
      const ByteData &signature, const std::string &message,
      const std::string &message_magic, Pubkey *pubkey = nullptr) const;

  /**
   * @brief Verify that the public key is in the correct format.
   * @param[in] byte_data pubkey bytedata
   * @retval true   valid format
   * @retval false  invalid format
   */
  static bool IsValid(const ByteData &byte_data);

  /**
   * @brief Compare the HEX values ​​of the two specified public keys.
   * @param[in] source        source target
   * @param[in] destination   destination target
   * @retval true   Large
   * @retval false  Small
   */
  static bool IsLarge(const Pubkey &source, const Pubkey &destination);

  /**
   * @brief combine pubkey.
   * @param[in] right   pubkey data
   * @return combined pubkey
   */
  Pubkey operator+=(const Pubkey &right);
  /**
   * @brief tweak add pubkey.
   * @param[in] right   tweak data
   * @return tweaked pubkey
   */
  Pubkey operator+=(const ByteData256 &right);
  /**
   * @brief negate and tweak add for pubkey.
   * @param[in] right   tweak data (before negate)
   * @return tweaked pubkey
   */
  Pubkey operator-=(const ByteData256 &right);
  /**
   * @brief tweak mul for pubkey.
   * @param[in] right   tweak data
   * @return tweaked pubkey
   */
  Pubkey operator*=(const ByteData256 &right);

 private:
  /**
   * @brief ByteData of PublicKey
   */
  ByteData data_;
}